

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageQueue.hpp
# Opt level: O3

void __thiscall
mq::
DerivedQueue<(anonymous_namespace)::Action,_std::deque<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>_>
::pop_front(DerivedQueue<(anonymous_namespace)::Action,_std::deque<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>_>
            *this)

{
  _Map_pointer ppAVar1;
  _Elt_pointer pAVar2;
  
  pAVar2 = (this->queue).
           super__Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (pAVar2 == (this->queue).
                super__Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
    operator_delete((this->queue).
                    super__Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
    ppAVar1 = (this->queue).
              super__Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    (this->queue).
    super__Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>
    ._M_impl.super__Deque_impl_data._M_start._M_node = ppAVar1 + 1;
    pAVar2 = ppAVar1[1];
    (this->queue).
    super__Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>
    ._M_impl.super__Deque_impl_data._M_start._M_first = pAVar2;
    (this->queue).
    super__Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>
    ._M_impl.super__Deque_impl_data._M_start._M_last = pAVar2 + 0x80;
  }
  else {
    pAVar2 = pAVar2 + 1;
  }
  (this->queue).
  super__Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = pAVar2;
  return;
}

Assistant:

void pop_front() final { queue.pop_front(); }